

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

listener_config_t *
add_listener(int fd,sockaddr *addr,socklen_t addrlen,int is_global,int proxy_protocol)

{
  listener_config_t **pplVar1;
  listener_config_t *plVar2;
  h2o_hostconf_t **pphVar3;
  listener_config_t *listener;
  int proxy_protocol_local;
  int is_global_local;
  socklen_t addrlen_local;
  sockaddr *addr_local;
  int fd_local;
  
  plVar2 = (listener_config_t *)h2o_mem_alloc(0xb8);
  memcpy(&plVar2->addr,addr,(ulong)addrlen);
  plVar2->fd = fd;
  plVar2->addrlen = addrlen;
  if (is_global == 0) {
    pphVar3 = (h2o_hostconf_t **)h2o_mem_alloc(8);
    plVar2->hosts = pphVar3;
    *plVar2->hosts = (h2o_hostconf_t *)0x0;
  }
  else {
    plVar2->hosts = (h2o_hostconf_t **)0x0;
  }
  memset(&plVar2->ssl,0,0x18);
  plVar2->proxy_protocol = proxy_protocol;
  conf.listeners =
       (listener_config_t **)h2o_mem_realloc(conf.listeners,(conf.num_listeners + 1) * 8);
  pplVar1 = conf.listeners + conf.num_listeners;
  conf.num_listeners = conf.num_listeners + 1;
  *pplVar1 = plVar2;
  return plVar2;
}

Assistant:

static struct listener_config_t *add_listener(int fd, struct sockaddr *addr, socklen_t addrlen, int is_global, int proxy_protocol)
{
    struct listener_config_t *listener = h2o_mem_alloc(sizeof(*listener));

    memcpy(&listener->addr, addr, addrlen);
    listener->fd = fd;
    listener->addrlen = addrlen;
    if (is_global) {
        listener->hosts = NULL;
    } else {
        listener->hosts = h2o_mem_alloc(sizeof(listener->hosts[0]));
        listener->hosts[0] = NULL;
    }
    memset(&listener->ssl, 0, sizeof(listener->ssl));
    listener->proxy_protocol = proxy_protocol;

    conf.listeners = h2o_mem_realloc(conf.listeners, sizeof(*conf.listeners) * (conf.num_listeners + 1));
    conf.listeners[conf.num_listeners++] = listener;

    return listener;
}